

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CPT.cpp
# Opt level: O0

void __thiscall CPT::SanityCheck(CPT *this)

{
  bool bVar1;
  double dVar2;
  matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>
  *pmVar3;
  const_reference pdVar4;
  ostream *poVar5;
  double in_RDI;
  size_t x;
  double psum;
  size_t y;
  size_t Y;
  size_t X;
  double p1;
  double i;
  matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>
  *this_00;
  
  dVar2 = (double)boost::numeric::ublas::
                  matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>
                  ::size1((matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>
                           *)((long)in_RDI + 8));
  pmVar3 = (matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>
            *)boost::numeric::ublas::
              matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>
              ::size2((matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>
                       *)((long)in_RDI + 8));
  for (this_00 = (matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>
                  *)0x0; this_00 < pmVar3;
      this_00 = (matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>
                 *)((long)&this_00->size1_ + 1)) {
    i = 0.0;
    for (p1 = 0.0; (ulong)p1 < (ulong)dVar2; p1 = (double)((long)p1 + 1)) {
      pdVar4 = boost::numeric::ublas::
               matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>
               ::operator()(this_00,(size_type)i,(size_type)p1);
      i = *pdVar4 + i;
    }
    bVar1 = Globals::EqualProbability(p1,in_RDI);
    if (!bVar1) {
      poVar5 = std::operator<<((ostream *)&std::cerr,"Warning! CPT::SanityCheck for y=");
      poVar5 = (ostream *)std::ostream::operator<<(poVar5,(ulong)this_00);
      poVar5 = std::operator<<(poVar5," doesn\'t sum to 1.0!");
      std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
    }
  }
  return;
}

Assistant:

void CPT::SanityCheck() const
{
    //cout << "Starting CPT::SanityCheck()"<<endl;
    size_t X = _m_probTable.size1();
    size_t Y = _m_probTable.size2();
    for(size_t y=0; y < Y; y++) 
    {
        double psum = 0.0;
        for(size_t x=0; x < X; x++) 
            psum += _m_probTable(x,y);
        if (! Globals::EqualProbability( psum, 1.0 ) )
            cerr << "Warning! CPT::SanityCheck for y="<<y<< 
                " doesn't sum to 1.0!" << endl;
    }

}